

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# node.cpp
# Opt level: O0

Node * DeleteAfter(Node *P)

{
  Node *ptr;
  Node *P_local;
  
  P_local = P->next;
  if (P_local == (node *)0x0) {
    P_local = (Node *)0x0;
  }
  else {
    P->next = P_local->next;
  }
  return P_local;
}

Assistant:

Node *DeleteAfter(Node *P) {  //删除P后面的一个单链表结点
    Node *ptr = P->next;  //保存当前结点的后继结点
    if(ptr == NULL)
        return NULL;
    P->next = ptr->next;  //当前结点指向原来结点的后继
    return ptr;    //返回指向被删除结点的指针

}